

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::queryTextureParamState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,GLenum pname
               ,QueriedState *state)

{
  bool bVar1;
  char *pcVar2;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<float[4]> local_48;
  
  if (7 < type - QUERY_TEXTURE_PARAM_INTEGER) {
    return;
  }
  switch(type) {
  case QUERY_TEXTURE_PARAM_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameteriv(gl,target,pname,(GLint *)(local_48.m_preguard + 1));
    pcVar2 = "glGetTexParameteriv";
    break;
  case QUERY_TEXTURE_PARAM_FLOAT:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterfv(gl,target,pname,local_48.m_preguard + 1);
    bVar1 = checkError(result,gl,"glGetTexParameterfv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT;
    (state->m_v).vInt = (GLint)local_48.m_preguard[1];
    return;
  case QUERY_TEXTURE_PARAM_PURE_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterIiv(gl,target,pname,(GLint *)(local_48.m_preguard + 1));
    pcVar2 = "GetTexParameterIiv";
    break;
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterIuiv(gl,target,pname,(GLuint *)(local_48.m_preguard + 1));
    bVar1 = checkError(result,gl,"GetTexParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER;
    goto LAB_0092c025;
  case QUERY_TEXTURE_PARAM_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameteriv(gl,target,pname,(GLint *)local_48.m_value);
    pcVar2 = "glGetTexParameteriv";
    goto LAB_0092c185;
  case QUERY_TEXTURE_PARAM_FLOAT_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterfv(gl,target,pname,local_48.m_value);
    bVar1 = checkError(result,gl,"glGetTexParameterfv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float[4]>::verifyValidity(&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT_VEC4;
    goto LAB_0092c1ae;
  case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterIiv(gl,target,pname,(GLint *)local_48.m_value);
    pcVar2 = "GetTexParameterIiv";
LAB_0092c185:
    bVar1 = checkError(result,gl,pcVar2);
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[4]> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_INTEGER_VEC4;
LAB_0092c1ae:
    (state->m_v).vInt = (GLint)local_48.m_value[0];
    (state->m_v).vIntVec3[1] = (GLint)local_48.m_value[1];
    (state->m_v).vIntVec3[2] = (GLint)local_48.m_value[2];
    (state->m_v).vIntVec3[3] = (GLint)local_48.m_value[3];
    return;
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
    local_48.m_postguard[0] = -8.0297587e+18;
    local_48.m_postguard[1] = -8.0297587e+18;
    local_48.m_postguard[2] = -8.0297587e+18;
    local_48.m_postguard[3] = -8.0297587e+18;
    local_48.m_value[0] = -8.0297587e+18;
    local_48.m_value[1] = -8.0297587e+18;
    local_48.m_value[2] = -8.0297587e+18;
    local_48.m_value[3] = -8.0297587e+18;
    local_48.m_preguard[0] = -8.0297587e+18;
    local_48.m_preguard[1] = -8.0297587e+18;
    local_48.m_preguard[2] = -8.0297587e+18;
    local_48.m_preguard[3] = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexParameterIuiv(gl,target,pname,(GLuint *)local_48.m_value);
    bVar1 = checkError(result,gl,"GetTexParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)&local_48,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER_VEC4;
    goto LAB_0092c1ae;
  }
  bVar1 = checkError(result,gl,pcVar2);
  if (!bVar1) {
    return;
  }
  bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_48,result);
  if (!bVar1) {
    return;
  }
  state->m_type = DATATYPE_INTEGER;
LAB_0092c025:
  (state->m_v).vInt = (GLint)local_48.m_preguard[1];
  return;
}

Assistant:

void queryTextureParamState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_TEXTURE_PARAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexParameteriv(target, pname, &value);

			if (!checkError(result, gl, "glGetTexParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetTexParameterfv(target, pname, &value);

			if (!checkError(result, gl, "glGetTexParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexParameterIiv(target, pname, &value);

			if (!checkError(result, gl, "GetTexParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetTexParameterIuiv(target, pname, &value);

			if (!checkError(result, gl, "GetTexParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetTexParameteriv(target, pname, value);

			if (!checkError(result, gl, "glGetTexParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_FLOAT_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat[4]> value;
			gl.glGetTexParameterfv(target, pname, value);

			if (!checkError(result, gl, "glGetTexParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetTexParameterIiv(target, pname, value);

			if (!checkError(result, gl, "GetTexParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLuint[4]> value;
			gl.glGetTexParameterIuiv(target, pname, value);

			if (!checkError(result, gl, "GetTexParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}